

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

int __thiscall Preprocessor::evaluateCondition(Preprocessor *this)

{
  stack<QByteArray,_QList<QByteArray>_> *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  PP_Expression local_88;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.super_Parser.symbols.d.d = (Data *)0x0;
  local_88.super_Parser.symbols.d.ptr = (Symbol *)0x0;
  local_88.super_Parser.symbols.d.size = 0;
  local_88.super_Parser.index = 0;
  local_88.super_Parser.displayWarnings = true;
  local_88.super_Parser.displayNotes = true;
  local_88.super_Parser.activeQtMode = false;
  local_88.super_Parser.qmlMacroWarningIsFatal = false;
  local_88.super_Parser._36_4_ = 0xaaaaaaaa;
  local_88.super_Parser.includes.d.d = (Data *)0x0;
  local_88.super_Parser.includes.d.ptr = (IncludePath *)0x0;
  local_88.super_Parser.includes.d.size = 0;
  local_88.super_Parser.currentFilenames.c.d.d = (Data *)0x0;
  local_88.super_Parser.currentFilenames.c.d.ptr = (QByteArray *)0x0;
  local_88.super_Parser.currentFilenames.c.d.size = 0;
  this_00 = &local_88.super_Parser.currentFilenames;
  QArrayDataPointer<QByteArray>::operator=
            ((QArrayDataPointer<QByteArray> *)this_00,
             (QArrayDataPointer<QByteArray> *)&(this->super_Parser).currentFilenames);
  substituteUntilNewline(this,(Symbols *)&local_88);
  local_88.super_Parser.index = 0;
  bVar1 = PP_Expression::unary_expression_lookup(&local_88);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = PP_Expression::conditional_expression(&local_88);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)this_00);
  QArrayDataPointer<Parser::IncludePath>::~QArrayDataPointer(&local_88.super_Parser.includes.d);
  QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int Preprocessor::evaluateCondition()
{
    PP_Expression expression;
    expression.currentFilenames = currentFilenames;

    substituteUntilNewline(expression.symbols);

    return expression.value();
}